

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgCoreOneDimensional.cpp
# Opt level: O0

void TasGrid::OneDimensionalNodes::getGaussJacobi
               (int m,vector<double,_std::allocator<double>_> *w,
               vector<double,_std::allocator<double>_> *x,double alpha,double beta)

{
  reference pvVar1;
  vector<double,_std::allocator<double>_> *in_R8;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dm;
  double di;
  int i;
  vector<double,_std::allocator<double>_> off_diag;
  allocator<double> local_59;
  undefined1 local_58 [8];
  vector<double,_std::allocator<double>_> diag;
  double mu0;
  double ab;
  double beta_local;
  double alpha_local;
  vector<double,_std::allocator<double>_> *x_local;
  vector<double,_std::allocator<double>_> *w_local;
  int m_local;
  
  dVar2 = alpha + beta;
  dVar3 = pow(2.0,dVar2 + 1.0);
  dVar4 = tgamma(alpha + 1.0);
  dVar5 = tgamma(beta + 1.0);
  dVar6 = tgamma(dVar2 + 2.0);
  diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)((dVar3 * dVar4 * dVar5) / dVar6);
  ::std::allocator<double>::allocator(&local_59);
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)local_58,(long)m,&local_59);
  ::std::allocator<double>::~allocator(&local_59);
  ::std::allocator<double>::allocator((allocator<double> *)((long)&di + 7));
  ::std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)&i,(long)(m + -1),
             (allocator<double> *)((long)&di + 7));
  ::std::allocator<double>::~allocator((allocator<double> *)((long)&di + 7));
  pvVar1 = ::std::vector<double,_std::allocator<double>_>::operator[]
                     ((vector<double,_std::allocator<double>_> *)local_58,0);
  *pvVar1 = (beta - alpha) / (dVar2 + 2.0);
  if (1 < m) {
    dVar3 = sqrt(((alpha + 1.0) * 4.0 * (beta + 1.0)) /
                 ((dVar2 + 3.0) * (dVar2 + 2.0) * (dVar2 + 2.0)));
    pvVar1 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)&i,0);
    *pvVar1 = dVar3;
    for (di._0_4_ = 1; di._0_4_ < m + -1; di._0_4_ = di._0_4_ + 1) {
      dVar3 = (double)(di._0_4_ + 1);
      pvVar1 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)local_58,(long)di._0_4_);
      *pvVar1 = (beta * beta + -(alpha * alpha)) /
                (((dVar3 + dVar3 + dVar2) - 2.0) * (dVar3 + dVar3 + dVar2));
      dVar3 = sqrt((dVar3 * 4.0 * (dVar3 + alpha) * (dVar3 + beta) * (dVar3 + dVar2)) /
                   (((dVar3 + dVar3 + dVar2) * (dVar3 + dVar3 + dVar2) + -1.0) *
                    (dVar3 + dVar3 + dVar2) * (dVar3 + dVar3 + dVar2)));
      pvVar1 = ::std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)&i,(long)di._0_4_);
      *pvVar1 = dVar3;
    }
    dVar3 = (double)m;
    pvVar1 = ::std::vector<double,_std::allocator<double>_>::operator[]
                       ((vector<double,_std::allocator<double>_> *)local_58,(long)(m + -1));
    *pvVar1 = (beta * beta + -(alpha * alpha)) /
              (((dVar3 + dVar3 + dVar2) - 2.0) * (dVar3 + dVar3 + dVar2));
  }
  TasmanianTridiagonalSolver::decompose
            ((TasmanianTridiagonalSolver *)local_58,(vector<double,_std::allocator<double>_> *)&i,x,
             (double)diag.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,w,in_R8);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)&i);
  ::std::vector<double,_std::allocator<double>_>::~vector
            ((vector<double,_std::allocator<double>_> *)local_58);
  return;
}

Assistant:

void OneDimensionalNodes::getGaussJacobi(int m, std::vector<double> &w, std::vector<double> &x, double alpha, double beta){
    double ab = alpha + beta;
    double mu0 = pow(2.0, 1.0 + ab) * tgamma(alpha + 1.0) * tgamma(beta + 1.0) / tgamma(2.0 + ab);
    std::vector<double> diag(m), off_diag(m-1);
    diag[0] = (beta - alpha) / (2.0 + ab);
    if (m > 1) {
        off_diag[0] =  std::sqrt(4.0 * (1.0 + alpha) * (1.0 + beta) / ((3.0 + ab) * (2.0 + ab) * (2.0 + ab)));
        for(int i=1; i<m-1; i++){
            double di = (double) (i+1);
            diag[i] =  (beta * beta - alpha * alpha) / ((2.0 * di + ab -2.0) * (2.0 * di + ab));
            off_diag[i] = std::sqrt(4.0 * di * (di + alpha) * (di + beta) * (di + ab) /
                                    (((2.0 * di + ab) * (2.0 * di + ab) - 1.0) * (2.0 * di + ab) * (2.0 * di + ab)));
        }
        double dm = (double) m;
        diag[m-1] = (beta * beta - alpha * alpha) / ((2.0 * dm + ab - 2.0) * (2.0 * dm + ab));;
    }
    TasmanianTridiagonalSolver::decompose(diag, off_diag, mu0, x, w);
}